

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::GeneratorHelpers::precision
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  uint *puVar1;
  UErrorCode *extraout_RDX;
  int32_t maxSig;
  int32_t minSig;
  UChar local_5a [9];
  char16_t *local_48;
  
  puVar1 = &switchD_0026c8b1::switchdataD_00320308;
  switch((macros->precision).fType) {
  case RND_NONE:
    UnicodeString::doAppend(sb,L"precision-unlimited",0,-1);
    break;
  case RND_FRACTION:
    blueprint_helpers::generateFractionStem
              ((int)(macros->precision).fUnion.fracSig.fMinFrac,
               (int)(macros->precision).fUnion.fracSig.fMaxFrac,sb,
               (UErrorCode *)&switchD_0026c8b1::switchdataD_00320308);
    break;
  case RND_SIGNIFICANT:
    minSig = (int32_t)(macros->precision).fUnion.fracSig.fMinSig;
    maxSig = (int32_t)(macros->precision).fUnion.fracSig.fMaxSig;
    goto LAB_0026c9a7;
  case RND_FRACTION_SIGNIFICANT:
    blueprint_helpers::generateFractionStem
              ((int)(macros->precision).fUnion.fracSig.fMinFrac,
               (int)(macros->precision).fUnion.fracSig.fMaxFrac,sb,
               (UErrorCode *)&switchD_0026c8b1::switchdataD_00320308);
    local_5a[0] = L'/';
    puVar1 = (uint *)0x1;
    UnicodeString::doAppend(sb,local_5a,0,1);
    minSig = (int32_t)(macros->precision).fUnion.fracSig.fMinSig;
    if (minSig == -1) {
      maxSig = (int32_t)(macros->precision).fUnion.fracSig.fMaxSig;
      minSig = 1;
    }
    else {
      maxSig = -1;
    }
LAB_0026c9a7:
    blueprint_helpers::generateDigitsStem(minSig,maxSig,sb,(UErrorCode *)puVar1);
    break;
  case RND_INCREMENT:
    UnicodeString::doAppend(sb,L"precision-increment/",0,-1);
    local_48 = L"precision-increment/";
    blueprint_helpers::generateIncrementOption
              ((macros->precision).fUnion.increment.fIncrement,
               (int)(macros->precision).fUnion.increment.fMinFrac -
               (int)(macros->precision).fUnion.increment.fMaxFrac,sb,extraout_RDX);
    break;
  case RND_CURRENCY:
    if ((macros->precision).fUnion.currencyUsage == UCURR_USAGE_STANDARD) {
      UnicodeString::doAppend(sb,L"precision-currency-standard",0,-1);
    }
    else {
      UnicodeString::doAppend(sb,L"precision-currency-cash",0,-1);
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool GeneratorHelpers::precision(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.precision.fType == Precision::RND_NONE) {
        sb.append(u"precision-unlimited", -1);
    } else if (macros.precision.fType == Precision::RND_FRACTION) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateFractionStem(impl.fMinFrac, impl.fMaxFrac, sb, status);
    } else if (macros.precision.fType == Precision::RND_SIGNIFICANT) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateDigitsStem(impl.fMinSig, impl.fMaxSig, sb, status);
    } else if (macros.precision.fType == Precision::RND_FRACTION_SIGNIFICANT) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateFractionStem(impl.fMinFrac, impl.fMaxFrac, sb, status);
        sb.append(u'/');
        if (impl.fMinSig == -1) {
            blueprint_helpers::generateDigitsStem(1, impl.fMaxSig, sb, status);
        } else {
            blueprint_helpers::generateDigitsStem(impl.fMinSig, -1, sb, status);
        }
    } else if (macros.precision.fType == Precision::RND_INCREMENT) {
        const Precision::IncrementSettings& impl = macros.precision.fUnion.increment;
        sb.append(u"precision-increment/", -1);
        blueprint_helpers::generateIncrementOption(
                impl.fIncrement,
                impl.fMinFrac - impl.fMaxFrac,
                sb,
                status);
    } else if (macros.precision.fType == Precision::RND_CURRENCY) {
        UCurrencyUsage usage = macros.precision.fUnion.currencyUsage;
        if (usage == UCURR_USAGE_STANDARD) {
            sb.append(u"precision-currency-standard", -1);
        } else {
            sb.append(u"precision-currency-cash", -1);
        }
    } else {
        // Bogus or Error
        return false;
    }

    // NOTE: Always return true for rounding because the default value depends on other options.
    return true;
}